

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O0

any __thiscall
Scine::Core::ModuleManager::Impl::get(Impl *this,string *interface,string *model,string *moduleName)

{
  undefined1 uVar1;
  bool bVar2;
  ulong uVar3;
  element_type *peVar4;
  ClassNotImplementedError *this_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<Scine::Core::Module> *modulePtr_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  ModuleList *__range4_1;
  LibraryAndModules *source_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  *__range3_1;
  string modulePtrLower;
  shared_ptr<Scine::Core::Module> *modulePtr;
  const_iterator __end4;
  const_iterator __begin4;
  ModuleList *__range4;
  LibraryAndModules *source;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  *__range3;
  string moduleNameLower;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  bool local_191;
  locale *in_stack_fffffffffffffe70;
  locale *Loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input;
  undefined7 in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  local_140;
  ModuleList *local_138;
  reference local_130;
  LibraryAndModules *local_128;
  __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
  local_120 [2];
  int local_110;
  byte local_109;
  string local_108 [32];
  undefined1 local_e8 [40];
  string local_c0 [32];
  reference local_a0;
  shared_ptr<Scine::Core::Module> *local_98;
  __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  local_90;
  ModuleList *local_88;
  reference local_80;
  LibraryAndModules *local_78;
  __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
  local_70 [4];
  locale local_50 [8];
  string local_48 [40];
  undefined8 local_20;
  undefined8 local_18;
  
  __lhs = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::locale::locale(local_50);
  boost::algorithm::to_lower_copy<std::__cxx11::string>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::locale::~locale(local_50);
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (uVar1 = std::operator!=(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58),
     (bool)uVar1)) {
    local_70[0]._M_current =
         (LibraryAndModules *)
         std::
         vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
         ::begin((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                  *)in_stack_fffffffffffffe58);
    local_78 = (LibraryAndModules *)
               std::
               vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
               ::end((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                      *)in_stack_fffffffffffffe58);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                               *)in_stack_fffffffffffffe60,
                              (__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                               *)in_stack_fffffffffffffe58), bVar2) {
      local_80 = __gnu_cxx::
                 __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                 ::operator*(local_70);
      local_88 = &local_80->modules;
      local_90._M_current =
           (shared_ptr<Scine::Core::Module> *)
           std::
           vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
           ::begin((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                    *)in_stack_fffffffffffffe58);
      local_98 = (shared_ptr<Scine::Core::Module> *)
                 std::
                 vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                 ::end((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                        *)in_stack_fffffffffffffe58);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                                 *)in_stack_fffffffffffffe60,
                                (__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                                 *)in_stack_fffffffffffffe58), bVar2) {
        local_a0 = __gnu_cxx::
                   __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                   ::operator*(&local_90);
        peVar4 = std::
                 __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1296b2);
        Loc = (locale *)(local_e8 + 8);
        (**(code **)(*(long *)peVar4 + 0x10))();
        Input = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
        std::locale::locale((locale *)Input);
        boost::algorithm::to_lower_copy<std::__cxx11::string>(Input,Loc);
        std::locale::~locale((locale *)local_e8);
        std::__cxx11::string::~string((string *)(local_e8 + 8));
        bVar2 = std::operator!=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        local_109 = 0;
        local_191 = false;
        if (bVar2) {
          std::operator+(__lhs,(char *)CONCAT17(uVar1,in_stack_fffffffffffffe80));
          local_109 = 1;
          local_191 = std::operator!=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        }
        if ((local_109 & 1) != 0) {
          std::__cxx11::string::~string(local_108);
        }
        if (local_191 == false) {
          peVar4 = std::
                   __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x12985e);
          uVar3 = (**(code **)(*(long *)peVar4 + 0x20))(peVar4,local_18,local_20);
          if ((uVar3 & 1) == 0) {
            local_110 = 0;
          }
          else {
            peVar4 = std::
                     __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x12988a);
            (**(code **)(*(long *)peVar4 + 0x18))(__lhs,peVar4,local_18,local_20);
            local_110 = 1;
          }
        }
        else {
          local_110 = 5;
        }
        std::__cxx11::string::~string(local_c0);
        if ((local_110 != 0) && (local_110 != 5)) goto LAB_00129a9a;
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
        ::operator++(&local_90);
      }
      __gnu_cxx::
      __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
      ::operator++(local_70);
    }
  }
  else {
    local_120[0]._M_current =
         (LibraryAndModules *)
         std::
         vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
         ::begin((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                  *)in_stack_fffffffffffffe58);
    local_128 = (LibraryAndModules *)
                std::
                vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                ::end((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                       *)in_stack_fffffffffffffe58);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                               *)in_stack_fffffffffffffe60,
                              (__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                               *)in_stack_fffffffffffffe58), bVar2) {
      local_130 = __gnu_cxx::
                  __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                  ::operator*(local_120);
      local_138 = &local_130->modules;
      local_140._M_current =
           (shared_ptr<Scine::Core::Module> *)
           std::
           vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
           ::begin((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                    *)in_stack_fffffffffffffe58);
      std::
      vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
      ::end((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
             *)in_stack_fffffffffffffe58);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                                 *)in_stack_fffffffffffffe60,
                                (__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                                 *)in_stack_fffffffffffffe58), bVar2) {
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
        ::operator*(&local_140);
        peVar4 = std::
                 __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1299e2);
        uVar3 = (**(code **)(*(long *)peVar4 + 0x20))(peVar4,local_18,local_20);
        if ((uVar3 & 1) != 0) {
          peVar4 = std::
                   __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x129a0b);
          (**(code **)(*(long *)peVar4 + 0x18))(__lhs,peVar4,local_18,local_20);
          local_110 = 1;
LAB_00129a9a:
          std::__cxx11::string::~string(local_48);
          return (any)(placeholder *)in_RDI;
        }
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
        ::operator++(&local_140);
      }
      __gnu_cxx::
      __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
      ::operator++(local_120);
    }
  }
  this_00 = (ClassNotImplementedError *)__cxa_allocate_exception(8);
  *this_00 = (ClassNotImplementedError)0x0;
  ClassNotImplementedError::ClassNotImplementedError(this_00);
  __cxa_throw(this_00,&ClassNotImplementedError::typeinfo,
              ClassNotImplementedError::~ClassNotImplementedError);
}

Assistant:

boost::any get(const std::string& interface, const std::string& model, const std::string& moduleName) const {
    std::string moduleNameLower = boost::algorithm::to_lower_copy(moduleName);
    if (!moduleName.empty() && moduleNameLower != "any") {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          std::string modulePtrLower = boost::algorithm::to_lower_copy(modulePtr->name());
          if ((modulePtrLower != moduleNameLower) && (modulePtrLower != moduleNameLower + "module")) {
            continue;
          }

          if (modulePtr->has(interface, model)) {
            return modulePtr->get(interface, model);
          }
        }
      }
    }
    else {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          if (modulePtr->has(interface, model)) {
            return modulePtr->get(interface, model);
          }
        }
      }
    }

    throw ClassNotImplementedError{};
  }